

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

bool __thiscall V2Transport::ShouldReconnectV1(V2Transport *this)

{
  long lVar1;
  bool bVar2;
  char *in_RDI;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock54;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock53;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  char *pszName;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  byte bVar3;
  UniqueLock<AnnotatedMixin<std::mutex>_> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pszName = in_RDI;
  AssertLockNotHeldInline
            ((char *)in_stack_ffffffffffffffa8,
             (char *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff9c,(Mutex *)0x20c7c4);
  AssertLockNotHeldInline
            ((char *)in_stack_ffffffffffffffa8,
             (char *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
             in_stack_ffffffffffffff9c,(Mutex *)0x20c7ea);
  if ((in_RDI[0x2d8] & 1U) == 0) {
    bVar3 = 0;
  }
  else {
    MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
              (in_stack_ffffffffffffffd8,
               (AnnotatedMixin<std::mutex> *)
               CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),pszName,
               (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
    if (in_RDI[0x518] == '\x01') {
      bVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                        (in_stack_ffffffffffffffa8);
      if (bVar2) {
        MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
                  (in_stack_ffffffffffffffd8,
                   (AnnotatedMixin<std::mutex> *)
                   CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),pszName,
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (int)((ulong)in_RDI >> 0x20),SUB81((ulong)in_RDI >> 0x18,0));
        bVar3 = in_RDI[0x5a1] & 1;
        UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
                  ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
                   CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      }
      else {
        bVar3 = 0;
      }
    }
    else {
      bVar3 = 0;
    }
    UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
              ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
               CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (bool)(bVar3 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool V2Transport::ShouldReconnectV1() const noexcept
{
    AssertLockNotHeld(m_send_mutex);
    AssertLockNotHeld(m_recv_mutex);
    // Only outgoing connections need reconnection.
    if (!m_initiating) return false;

    LOCK(m_recv_mutex);
    // We only reconnect in the very first state and when the receive buffer is empty. Together
    // these conditions imply nothing has been received so far.
    if (m_recv_state != RecvState::KEY) return false;
    if (!m_recv_buffer.empty()) return false;
    // Check if we've sent enough for the other side to disconnect us (if it was V1).
    LOCK(m_send_mutex);
    return m_sent_v1_header_worth;
}